

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_manager.cpp
# Opt level: O2

LogConfig * __thiscall
duckdb::LogManager::GetConfig(LogConfig *__return_storage_ptr__,LogManager *this)

{
  unique_lock<std::mutex> lck;
  unique_lock<std::mutex> local_20;
  
  ::std::unique_lock<std::mutex>::unique_lock(&local_20,&this->lock);
  LogConfig::LogConfig(__return_storage_ptr__,&this->config);
  ::std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return __return_storage_ptr__;
}

Assistant:

LogConfig LogManager::GetConfig() {
	unique_lock<mutex> lck(lock);
	return config;
}